

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit)

{
  byte bVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  int iVar4;
  uint uVar5;
  Kit_DsdObj_t *pKVar6;
  Kit_DsdObj_t *pKVar7;
  uint *puVar8;
  uint *pOut;
  uint *pIn;
  uint uVar9;
  ulong uVar10;
  uint nLitsNew;
  Kit_DsdObj_t *local_80;
  uint piLitsNew [16];
  
  nLitsNew = 0;
  iVar4 = Abc_Lit2Var(iLit);
  pKVar6 = Kit_DsdNtkObj(p,iVar4);
  if (pKVar6 == (Kit_DsdObj_t *)0x0) {
    return iLit;
  }
  uVar5 = (uint)*pKVar6 >> 6 & 7;
  if (uVar5 == 5) {
    pKVar7 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)*pKVar6 >> 0x1a);
    KVar2 = *pKVar6;
    puVar8 = (uint *)0x0;
    pIn = (uint *)(&pKVar6[1].field_0x0 + ((uint)KVar2 >> 8 & 0x3fc));
    if (((uint)KVar2 & 0x1c0) != 0x140) {
      pIn = puVar8;
    }
    local_80 = pKVar7 + 1;
    pOut = (uint *)(&pKVar7[1].field_0x0 + ((uint)*pKVar7 >> 8 & 0x3fc));
    if (((uint)*pKVar7 & 0x1c0) != 0x140) {
      pOut = puVar8;
    }
    Kit_TruthCopy(pOut,pIn,(uint)KVar2 >> 0x1a);
    for (; pKVar3 = local_80, puVar8 < (uint *)(ulong)((uint)*pKVar6 >> 0x1a);
        puVar8 = (uint *)((long)puVar8 + 1)) {
      uVar5 = Kit_DsdExpandNode_rec
                        (pNew,p,(uint)*(ushort *)(&pKVar6[1].field_0x0 + (long)puVar8 * 2));
      *(short *)(&pKVar7[1].field_0x0 + (long)puVar8 * 2) = (short)uVar5;
      iVar4 = Abc_LitIsCompl(uVar5 & 0xffff);
      if (iVar4 != 0) {
        iVar4 = Abc_LitRegular((uint)*(ushort *)(&pKVar7[1].field_0x0 + (long)puVar8 * 2));
        *(short *)(&pKVar7[1].field_0x0 + (long)puVar8 * 2) = (short)iVar4;
        Kit_TruthChangePhase(pOut,(uint)*pKVar7 >> 0x1a,(int)puVar8);
      }
    }
    if ((uint)*pKVar6 >> 0x1a != 3) {
LAB_004c599d:
      iVar4 = Abc_LitIsCompl(iLit);
      if (iVar4 != 0) {
        Kit_TruthNot(pOut,pOut,(uint)*pKVar6 >> 0x1a);
      }
      uVar9 = (uint)*pKVar7 & 0x3f;
      uVar5 = 0;
      goto LAB_004c5a79;
    }
    uVar5 = *pOut;
    if (uVar5 == 0x3a3a3a3a) {
LAB_004c59da:
      iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar7[1].field_0x2);
      *(short *)&pKVar7[1].field_0x2 = (short)iVar4;
    }
    else if (uVar5 != 0xcacacaca) {
      if (uVar5 == 0x35353535) {
        iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar7 + 1));
        *(short *)(pKVar7 + 1) = (short)iVar4;
        goto LAB_004c59da;
      }
      if (uVar5 != 0xc5c5c5c5) goto LAB_004c599d;
      iVar4 = Abc_LitNot((uint)*(ushort *)local_80);
      *(ushort *)pKVar3 = (ushort)iVar4;
    }
    *pOut = 0xcacacaca;
    iVar4 = Abc_LitIsCompl((uint)*(ushort *)(pKVar7 + 2));
    if (iVar4 != 0) {
      bVar1 = *(byte *)(pKVar7 + 1);
      *(undefined2 *)(pKVar7 + 1) = *(undefined2 *)&pKVar7[1].field_0x2;
      *(ushort *)&pKVar7[1].field_0x2 = (ushort)bVar1;
      iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar7 + 2));
      *(short *)(pKVar7 + 2) = (short)iVar4;
    }
    iVar4 = Abc_LitIsCompl((uint)*(ushort *)&pKVar7[1].field_0x2);
    if (iVar4 != 0) {
      iLit = Abc_LitNot(iLit);
      iVar4 = Abc_LitNot((uint)*(ushort *)(pKVar7 + 1));
      *(short *)(pKVar7 + 1) = (short)iVar4;
      iVar4 = Abc_LitNot((uint)*(ushort *)&pKVar7[1].field_0x2);
      *(short *)&pKVar7[1].field_0x2 = (short)iVar4;
    }
    KVar2 = *pKVar7;
    uVar5 = Abc_LitIsCompl(iLit);
  }
  else {
    if (uVar5 == 4) {
      uVar5 = Abc_LitIsCompl(iLit);
      uVar9 = Abc_LitRegular(iLit);
      Kit_DsdExpandCollectXor_rec(p,uVar9,piLitsNew,(int *)&nLitsNew);
      pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,nLitsNew);
      for (uVar10 = 0; uVar10 < (uint)*pKVar6 >> 0x1a; uVar10 = uVar10 + 1) {
        uVar9 = piLitsNew[uVar10];
        iVar4 = Abc_LitRegular(uVar9);
        iVar4 = Kit_DsdExpandNode_rec(pNew,p,iVar4);
        *(short *)(&pKVar6[1].field_0x0 + uVar10 * 2) = (short)iVar4;
        uVar9 = Abc_LitIsCompl(uVar9);
        uVar5 = uVar5 ^ uVar9;
      }
      uVar9 = (uint)*pKVar6 & 0x3f;
      goto LAB_004c5a79;
    }
    if (uVar5 != 3) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x564,"int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int)");
    }
    uVar5 = Abc_LitRegular(iLit);
    Kit_DsdExpandCollectAnd_rec(p,uVar5,piLitsNew,(int *)&nLitsNew);
    pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,nLitsNew);
    for (uVar10 = 0; KVar2 = *pKVar6, uVar10 < (uint)KVar2 >> 0x1a; uVar10 = uVar10 + 1) {
      iVar4 = Kit_DsdExpandNode_rec(pNew,p,piLitsNew[uVar10]);
      *(short *)(&pKVar6[1].field_0x0 + uVar10 * 2) = (short)iVar4;
    }
    uVar5 = Abc_LitIsCompl(iLit);
  }
  uVar9 = (uint)KVar2 & 0x3f;
LAB_004c5a79:
  iVar4 = Abc_Var2Lit(uVar9,uVar5);
  return iVar4;
}

Assistant:

int Kit_DsdExpandNode_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit )
{
    unsigned * pTruth, * pTruthNew;
    unsigned i, iLitFanin, piLitsNew[16], nLitsNew = 0;
    Kit_DsdObj_t * pObj, * pObjNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_DsdExpandCollectAnd_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, piLitsNew[i] );
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        Kit_DsdExpandCollectXor_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
        {
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, Abc_LitRegular(piLitsNew[i]) );
            fCompl ^= Abc_LitIsCompl(piLitsNew[i]);
        }
        return Abc_Var2Lit( pObjNew->Id, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, iLitFanin );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }

    if ( pObj->nFans == 3 && 
        (pTruthNew[0] == 0xCACACACA || pTruthNew[0] == 0xC5C5C5C5 || 
         pTruthNew[0] == 0x3A3A3A3A || pTruthNew[0] == 0x35353535) )
    {
        // translate into regular MUXes
        if ( pTruthNew[0] == 0xC5C5C5C5 )
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
        else if ( pTruthNew[0] == 0x3A3A3A3A )
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        else if ( pTruthNew[0] == 0x35353535 )
        {
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        pTruthNew[0] = 0xCACACACA;
        // resolve the complemented control input
        if ( Abc_LitIsCompl(pObjNew->pFans[2]) )
        {
            unsigned char Temp = pObjNew->pFans[0];
            pObjNew->pFans[0] = pObjNew->pFans[1];
            pObjNew->pFans[1] = Temp;
            pObjNew->pFans[2] = Abc_LitNot(pObjNew->pFans[2]);
        }
        // resolve the complemented true input
        if ( Abc_LitIsCompl(pObjNew->pFans[1]) )
        {
            iLit = Abc_LitNot(iLit);
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    else
    {
        // if the incoming phase is complemented, absorb it into the prime node
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
        return Abc_Var2Lit( pObjNew->Id, 0 );
    }
}